

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixEnv::UnlockFile(PosixEnv *this,FileLock *lock)

{
  int iVar1;
  string *fname;
  PosixFileLock *in_RDX;
  long in_RSI;
  char *in_RDI;
  PosixFileLock *posix_file_lock;
  PosixLockTable *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  PosixFileLock *context;
  
  context = in_RDX;
  PosixFileLock::fd(in_RDX);
  iVar1 = LockOrUnlock((int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  if (iVar1 == -1) {
    (anonymous_namespace)::PosixFileLock::filename_abi_cxx11_((PosixFileLock *)in_RDX);
    iVar1 = (int)((ulong)in_RDX >> 0x20);
    std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    __errno_location();
    PosixError((string *)context,iVar1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  }
  else {
    fname = (string *)(in_RSI + 0xc0);
    (anonymous_namespace)::PosixFileLock::filename_abi_cxx11_((PosixFileLock *)in_RDX);
    PosixLockTable::Remove(in_stack_ffffffffffffffa0,fname);
    iVar1 = PosixFileLock::fd(in_RDX);
    close(iVar1);
    if (in_RDX != (PosixFileLock *)0x0) {
      (*(in_RDX->super_FileLock)._vptr_FileLock[1])();
    }
    Status::OK();
  }
  return (Status)in_RDI;
}

Assistant:

Status UnlockFile(FileLock* lock) override {
    PosixFileLock* posix_file_lock = static_cast<PosixFileLock*>(lock);
    if (LockOrUnlock(posix_file_lock->fd(), false) == -1) {
      return PosixError("unlock " + posix_file_lock->filename(), errno);
    }
    locks_.Remove(posix_file_lock->filename());
    ::close(posix_file_lock->fd());
    delete posix_file_lock;
    return Status::OK();
  }